

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeInstruction
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  Op OVar1;
  iterator iVar2;
  SENode *pSVar3;
  Instruction *local_10;
  
  local_10 = inst;
  iVar2 = std::
          _Rb_tree<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>,_std::_Select1st<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
          ::find(&(this->recurrent_node_map_)._M_t,&local_10);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header) {
    OVar1 = local_10->opcode_;
    if ((OVar1 == OpConstant) || (OVar1 == OpConstantNull)) {
      pSVar3 = AnalyzeConstant(this,local_10);
    }
    else if ((OVar1 == OpIAdd) || (OVar1 == OpISub)) {
      pSVar3 = AnalyzeAddOp(this,local_10);
    }
    else if (OVar1 == OpIMul) {
      pSVar3 = AnalyzeMultiplyOp(this,local_10);
    }
    else if (OVar1 == OpPhi) {
      pSVar3 = AnalyzePhiInstruction(this,local_10);
    }
    else {
      pSVar3 = CreateValueUnknownNode(this,local_10);
    }
  }
  else {
    pSVar3 = (SENode *)iVar2._M_node[1]._M_parent;
  }
  return pSVar3;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeInstruction(const Instruction* inst) {
  auto itr = recurrent_node_map_.find(inst);
  if (itr != recurrent_node_map_.end()) return itr->second;

  SENode* output = nullptr;
  switch (inst->opcode()) {
    case spv::Op::OpPhi: {
      output = AnalyzePhiInstruction(inst);
      break;
    }
    case spv::Op::OpConstant:
    case spv::Op::OpConstantNull: {
      output = AnalyzeConstant(inst);
      break;
    }
    case spv::Op::OpISub:
    case spv::Op::OpIAdd: {
      output = AnalyzeAddOp(inst);
      break;
    }
    case spv::Op::OpIMul: {
      output = AnalyzeMultiplyOp(inst);
      break;
    }
    default: {
      output = CreateValueUnknownNode(inst);
      break;
    }
  }

  return output;
}